

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestAssert.h
# Opt level: O2

void CppUnit::assertEquals<double>
               (double *expected,double *actual,SourceLine *sourceLine,string *message)

{
  double x;
  assertion_traits<double> *this;
  allocator<char> local_f1;
  string local_f0 [32];
  string local_d0;
  string local_b0;
  AdditionalMessage local_90 [120];
  
  x = *expected;
  if ((x != *actual) || (NAN(x) || NAN(*actual))) {
    this = (assertion_traits<double> *)actual;
    assertion_traits<double>::toString_abi_cxx11_(&local_b0,(assertion_traits<double> *)actual,x);
    assertion_traits<double>::toString_abi_cxx11_(&local_d0,this,*actual);
    CppUnit::AdditionalMessage::AdditionalMessage(local_90,(string *)message);
    std::__cxx11::string::string<std::allocator<char>>
              (local_f0,"equality assertion failed",&local_f1);
    CppUnit::Asserter::failNotEqual(&local_b0,&local_d0,sourceLine,local_90,local_f0);
    std::__cxx11::string::~string(local_f0);
    CppUnit::Message::~Message((Message *)local_90);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return;
}

Assistant:

void assertEquals( const T& expected,
                   const T& actual,
                   SourceLine sourceLine,
                   const std::string &message )
{
  if ( !assertion_traits<T>::equal(expected,actual) ) // lazy toString conversion...
  {
    Asserter::failNotEqual( assertion_traits<T>::toString(expected),
                            assertion_traits<T>::toString(actual),
                            sourceLine,
                            message );
  }
}